

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.cxx
# Opt level: O0

void JsonErrors::INVALID_INT(Value *value,cmJSONState *state)

{
  allocator<char> local_59;
  string local_58;
  ErrorGenerator local_38;
  cmJSONState *local_18;
  cmJSONState *state_local;
  Value *value_local;
  
  local_18 = state;
  state_local = (cmJSONState *)value;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"an integer",&local_59);
  EXPECTED_TYPE(&local_38,&local_58);
  std::function<void_(const_Json::Value_*,_cmJSONState_*)>::operator()
            (&local_38,(Value *)state_local,local_18);
  std::function<void_(const_Json::Value_*,_cmJSONState_*)>::~function(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

void INVALID_INT(const Json::Value* value, cmJSONState* state)
{
  JsonErrors::EXPECTED_TYPE("an integer")(value, state);
}